

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O2

void __thiscall OnDiskIndex::prefetch(OnDiskIndex *this,TriGram trigram)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  
  pVar1 = get_run_offsets(this,trigram);
  RawFile::prefetch(&this->ndxfile,pVar1.second - pVar1.first,pVar1.first);
  return;
}

Assistant:

void OnDiskIndex::prefetch(TriGram trigram) const {
    std::pair<uint64_t, uint64_t> offsets = get_run_offsets(trigram);
    uint64_t length = offsets.second - offsets.first;
    ndxfile.prefetch(length, offsets.first);
}